

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_socket.cpp
# Opt level: O0

bool __thiscall cppnet::ConnectSocket::Bind(ConnectSocket *this,string *ip,uint16_t port)

{
  bool bVar1;
  SingletonLogger *pSVar2;
  char *pcVar3;
  SysCallInt32Result SVar4;
  AddressType at;
  SysCallInt64Result SVar5;
  int local_40;
  uint32_t uStack_3c;
  SysCallInt32Result ret;
  SysCallInt64Result ret_1;
  uint16_t port_local;
  string *ip_local;
  ConnectSocket *this_local;
  
  if ((this->super_Socket)._sock == 0) {
    bVar1 = Address::IsIpv4(ip);
    SVar5 = OsHandle::TcpSocket(bVar1);
    if (SVar5._return_value < 0) {
      pSVar2 = Singleton<cppnet::SingletonLogger>::Instance();
      pcVar3 = ErrnoInfo(SVar5._errno);
      SingletonLogger::Error
                (pSVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/socket/connect_socket.cpp"
                 ,0x28,"create socket failed. errno:%d, info:%s",(ulong)(uint)SVar5._errno,pcVar3);
      return false;
    }
    (this->super_Socket)._sock = SVar5._return_value;
  }
  bVar1 = Address::IsIpv4(ip);
  at = AT_IPV6;
  if (bVar1) {
    at = AT_IPV4;
  }
  Address::SetType(&(this->super_Socket)._addr,at);
  Address::SetIp(&(this->super_Socket)._addr,ip);
  Address::SetAddrPort(&(this->super_Socket)._addr,port);
  SVar4 = OsHandle::Bind((this->super_Socket)._sock,&(this->super_Socket)._addr);
  local_40 = SVar4._return_value;
  if (-1 >= local_40) {
    pSVar2 = Singleton<cppnet::SingletonLogger>::Instance();
    uStack_3c = SVar4._errno;
    pcVar3 = ErrnoInfo(uStack_3c);
    SingletonLogger::Fatal
              (pSVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/socket/connect_socket.cpp"
               ,0x35,"bind socket filed! error:%d, info:%s",(ulong)uStack_3c,pcVar3);
    OsHandle::Close((this->super_Socket)._sock);
  }
  return -1 < local_40;
}

Assistant:

bool ConnectSocket::Bind(const std::string& ip, uint16_t port) {
    if (_sock == 0) {
        auto ret = OsHandle::TcpSocket(Address::IsIpv4(ip));
        if (ret._return_value < 0) {
            LOG_ERROR("create socket failed. errno:%d, info:%s", ret._errno, ErrnoInfo(ret._errno));
            return false;
        }
        _sock = ret._return_value;
    }
    _addr.SetType(Address::IsIpv4(ip) ? AT_IPV4 : AT_IPV6);
    _addr.SetIp(ip);
    _addr.SetAddrPort(port);

    auto ret = OsHandle::Bind(_sock, _addr);

#ifndef __win__ // WEPOLL don't support reuse_port
    if (ret._return_value < 0 && __reuse_port) {
        LOG_FATAL("bind socket filed! error:%d, info:%s", ret._errno, ErrnoInfo(ret._errno));
        OsHandle::Close(_sock);
        return false;
    }
#endif

    return true;
}